

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cpp
# Opt level: O2

void __thiscall pool_display::test_method(pool_display *this)

{
  undefined1 uVar1;
  __type _Var2;
  allocator<char> aVar3;
  byte bVar4;
  int iVar5;
  string *psVar6;
  long lVar7;
  long lVar8;
  long *plVar9;
  size_t sVar10;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>_>
  *this_00;
  const_iterator cVar11;
  ostream *poVar12;
  istringstream *piVar13;
  Entity *entity;
  string name_entity;
  allocator<char> local_a10 [8];
  undefined8 local_a08;
  shared_count sStack_a00;
  string aSignalName;
  char *local_9d8;
  char *local_9d0;
  string sub_s_output_wgph;
  string sub_str_to_test;
  string s_crmk;
  string s_output_wgph;
  string str_to_test;
  istringstream an_iss;
  undefined7 uStack_927;
  shared_count sStack_918;
  string *local_910;
  fstream the_debug_file;
  streambuf local_790 [504];
  output_test_stream output;
  shared_count asStack_588 [46];
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  ostringstream oss_output_wgph;
  
  psVar6 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&the_debug_file,"MyEntity",(allocator<char> *)&an_iss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"MyEntityInst",(allocator<char> *)&oss_output_wgph);
  lVar7 = dynamicgraph::FactoryStorage::newEntity(psVar6,(string *)&the_debug_file);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&the_debug_file);
  psVar6 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&the_debug_file,"MyEntity",(allocator<char> *)&an_iss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"MyEntityInst",(allocator<char> *)&oss_output_wgph);
  lVar8 = dynamicgraph::FactoryStorage::newEntity(psVar6,(string *)&the_debug_file);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&the_debug_file);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x44);
  output = (output_test_stream)(lVar8 == lVar7);
  asStack_588[0].pi_ = (sp_counted_base *)0x0;
  _an_iss = (undefined **)0x1201f4;
  _the_debug_file = &PTR__lazy_ostream_00129cd8;
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_1d0 = "";
  local_790._0_8_ = (allocator<char> *)&an_iss;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_588);
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e8,0x48);
  output = (output_test_stream)0x0;
  asStack_588[0].pi_ = (sp_counted_base *)0x0;
  _an_iss = (undefined **)0x1201f9;
  _the_debug_file = &PTR__lazy_ostream_00129cd8;
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_200 = "";
  local_790._0_8_ = (allocator<char> *)&an_iss;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_588);
  psVar6 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&the_debug_file,"MyEntityInstFailure",(allocator<char> *)&output);
  dynamicgraph::FactoryStorage::deregisterEntity(psVar6);
  std::__cxx11::string::~string((string *)&the_debug_file);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_218,0x51);
  output = (output_test_stream)0x0;
  asStack_588[0].pi_ = (sp_counted_base *)0x0;
  _an_iss = (undefined **)0x1201f9;
  _the_debug_file = &PTR__lazy_ostream_00129cd8;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_230 = "";
  local_790._0_8_ = (allocator<char> *)&an_iss;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_588);
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(&output,&local_248,1);
  psVar6 = (string *)dynamicgraph::PoolStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&the_debug_file,"MyEntityInst",(allocator<char> *)&an_iss);
  plVar9 = (long *)dynamicgraph::PoolStorage::getEntity(psVar6);
  std::__cxx11::string::~string((string *)&the_debug_file);
  (**(code **)(*plVar9 + 0x30))(plVar9,&output);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x57);
  local_278 = "Hello! My name is MyEntityInst !\n";
  sVar10 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                     ("Hello! My name is MyEntityInst !\n");
  local_270 = "Hello! My name is MyEntityInst !\n" + sVar10;
  boost::test_tools::output_test_stream::is_equal(&an_iss,&output,&local_278,1);
  _oss_output_wgph = "output.is_equal(\"Hello! My name is MyEntityInst !\\n\")";
  _the_debug_file = &PTR__lazy_ostream_00129cd8;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_280 = "";
  local_790._0_8_ = &oss_output_wgph;
  boost::test_tools::tt_detail::report_assertion(&an_iss,&the_debug_file,&local_288,0x57,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_918);
  psVar6 = (string *)dynamicgraph::PoolStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&the_debug_file,"MyEntityInstFailure",(allocator<char> *)&an_iss);
  dynamicgraph::PoolStorage::getEntity(psVar6);
  std::__cxx11::string::~string((string *)&the_debug_file);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_298,0x60);
  an_iss = (istringstream)0x0;
  sStack_918.pi_ = (sp_counted_base *)0x0;
  _oss_output_wgph = "res";
  _the_debug_file = &PTR__lazy_ostream_00129cd8;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_2b0 = "";
  local_790._0_8_ = &oss_output_wgph;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_918);
  dynamicgraph::PoolStorage::getInstance();
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>_>
             *)dynamicgraph::PoolStorage::getEntityMap_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&the_debug_file,"MyEntityInst",(allocator<char> *)&an_iss);
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>_>
           ::find(this_00,(key_type *)&the_debug_file);
  std::__cxx11::string::~string((string *)&the_debug_file);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c8,0x67);
  an_iss = (istringstream)(cVar11._M_node != (_Base_ptr)(this_00 + 8));
  sStack_918.pi_ = (sp_counted_base *)0x0;
  _oss_output_wgph = "!testExistence";
  _the_debug_file = &PTR__lazy_ostream_00129cd8;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_2e0 = "";
  local_790._0_8_ = &oss_output_wgph;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_918);
  psVar6 = (string *)dynamicgraph::PoolStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&the_debug_file,"MyEntityInst",(allocator<char> *)&an_iss);
  uVar1 = dynamicgraph::PoolStorage::existEntity(psVar6,(Entity **)&the_debug_file);
  std::__cxx11::string::~string((string *)&the_debug_file);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f8,0x6d);
  _an_iss = (undefined **)CONCAT71(uStack_927,uVar1);
  sStack_918.pi_ = (sp_counted_base *)0x0;
  _oss_output_wgph = "testExistence";
  _the_debug_file = &PTR__lazy_ostream_00129cd8;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_310 = "";
  local_790._0_8_ = &oss_output_wgph;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_918);
  poVar12 = (ostream *)dynamicgraph::PoolStorage::getInstance();
  dynamicgraph::PoolStorage::writeCompletionList(poVar12);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_328,0x73);
  local_348 = "MyEntityInst.in_double\nMyEntityInst.out_double\nprint\nsignals\nsignalDep\n";
  sVar10 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                     ("MyEntityInst.in_double\nMyEntityInst.out_double\nprint\nsignals\nsignalDep\n"
                     );
  local_340 = "MyEntityInst.in_double\nMyEntityInst.out_double\nprint\nsignals\nsignalDep\n" +
              sVar10;
  boost::test_tools::output_test_stream::is_equal(&an_iss,&output,&local_348,1);
  _oss_output_wgph =
       "output.is_equal(\"MyEntityInst.in_double\\nMyEntityInst.out_double\\n\" \"print\\nsignals\\nsignalDep\\n\")"
  ;
  _the_debug_file = &PTR__lazy_ostream_00129cd8;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_350 = "";
  local_790._0_8_ = &oss_output_wgph;
  boost::test_tools::tt_detail::report_assertion(&an_iss,&the_debug_file,&local_358,0x73,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_918);
  psVar6 = (string *)dynamicgraph::PoolStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&the_debug_file,"output.dot",(allocator<char> *)&an_iss);
  dynamicgraph::PoolStorage::writeGraph(psVar6);
  std::__cxx11::string::~string((string *)&the_debug_file);
  std::fstream::fstream(&the_debug_file);
  std::fstream::open((char *)&the_debug_file,0x120323);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_output_wgph);
  std::ostream::operator<<(&oss_output_wgph,local_790);
  std::fstream::close();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str_to_test,
             "/* This graph has been automatically generated.\n   2019 Month: 2 Day: 28 Time: 11:28 */\ndigraph \"output\" { \t graph [ label=\"output\" bgcolor = white rankdir=LR ]\n\t node [ fontcolor = black, color = black,fillcolor = gold1, style=filled, shape=box ] ; \n\tsubgraph cluster_Entities { \n\t} \n\"MyEntityInst\" [ label = \"MyEntityInst\" ,\n   fontcolor = black, color = black, fillcolor=cyan, style=filled, shape=box ]\n}\n"
             ,(allocator<char> *)&an_iss);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s_crmk,"*/",(allocator<char> *)&an_iss);
  std::__cxx11::string::find((string *)&s_output_wgph,(ulong)&s_crmk);
  std::__cxx11::string::substr((ulong)&sub_s_output_wgph,(ulong)&s_output_wgph);
  std::__cxx11::string::find((string *)&str_to_test,(ulong)&s_crmk);
  std::__cxx11::string::substr((ulong)&sub_str_to_test,(ulong)&str_to_test);
  _Var2 = std::operator==(&sub_str_to_test,&sub_s_output_wgph);
  poVar12 = std::operator<<((ostream *)&std::cout,(string *)&sub_str_to_test);
  std::endl<char,std::char_traits<char>>(poVar12);
  poVar12 = std::operator<<((ostream *)&std::cout,(string *)&sub_s_output_wgph);
  std::endl<char,std::char_traits<char>>(poVar12);
  iVar5 = std::__cxx11::string::compare((string *)&sub_str_to_test);
  poVar12 = (ostream *)std::ostream::operator<<(&std::cout,iVar5);
  std::endl<char,std::char_traits<char>>(poVar12);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_368,0x9c);
  aSignalName._M_string_length = 0;
  aSignalName.field_2._M_allocated_capacity = 0;
  local_910 = &name_entity;
  name_entity._M_dataplus._M_p = "two_sub_string_identical";
  name_entity._M_string_length = (long)"two_sub_string_identical" + 0x18;
  _an_iss = &PTR__lazy_ostream_00129cd8;
  sStack_918.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_380 = "";
  aSignalName._M_dataplus._M_p._0_1_ = _Var2;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&aSignalName.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&aSignalName,"MyEntityInst.in_double",(allocator<char> *)&name_entity);
  std::__cxx11::istringstream::istringstream((istringstream *)&an_iss,(string *)&aSignalName,_S_in);
  std::__cxx11::string::~string((string *)&aSignalName);
  piVar13 = (istringstream *)dynamicgraph::PoolStorage::getInstance();
  lVar7 = dynamicgraph::PoolStorage::getSignal(piVar13);
  std::__cxx11::string::string((string *)&aSignalName,(string *)(lVar7 + 8));
  aVar3 = (allocator<char>)
          std::operator==(&aSignalName,"MyEntity(MyEntityInst)::input(double)::in_double");
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_398,0xa7);
  local_a08 = 0;
  sStack_a00.pi_ = (sp_counted_base *)0x0;
  local_9d8 = "testExistence";
  local_9d0 = "";
  name_entity._M_string_length = name_entity._M_string_length & 0xffffffffffffff00;
  name_entity._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00129cd8;
  name_entity.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_3b0 = "";
  name_entity.field_2._8_8_ = &local_9d8;
  local_a10[0] = aVar3;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_a00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name_entity,"MyEntityInst.in2double",local_a10);
  std::__cxx11::stringbuf::str((string *)&sStack_918);
  std::__cxx11::string::~string((string *)&name_entity);
  piVar13 = (istringstream *)dynamicgraph::PoolStorage::getInstance();
  dynamicgraph::PoolStorage::getSignal(piVar13);
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3c8,0xb1);
  local_a10[0] = (allocator<char>)0x0;
  local_a08 = 0;
  sStack_a00.pi_ = (sp_counted_base *)0x0;
  local_9d8 = "res";
  local_9d0 = "";
  name_entity._M_string_length = name_entity._M_string_length & 0xffffffffffffff00;
  name_entity._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00129cd8;
  name_entity.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_3e0 = "";
  name_entity.field_2._8_8_ = &local_9d8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_a00);
  psVar6 = (string *)dynamicgraph::PoolStorage::getInstance();
  dynamicgraph::PoolStorage::deregisterEntity(psVar6);
  psVar6 = (string *)dynamicgraph::PoolStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name_entity,"MyEntityInst",local_a10);
  bVar4 = dynamicgraph::PoolStorage::existEntity(psVar6,(Entity **)&name_entity);
  std::__cxx11::string::~string((string *)&name_entity);
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3f8,0xba);
  local_a10[0] = (allocator<char>)(bVar4 ^ 1);
  local_a08 = 0;
  sStack_a00.pi_ = (sp_counted_base *)0x0;
  local_9d8 = "!testExistence";
  local_9d0 = "";
  name_entity._M_string_length = name_entity._M_string_length & 0xffffffffffffff00;
  name_entity._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00129cd8;
  name_entity.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_410 = "";
  name_entity.field_2._8_8_ = &local_9d8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_a00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name_entity,"MyEntityInst2",local_a10);
  psVar6 = (string *)dynamicgraph::PoolStorage::getInstance();
  dynamicgraph::PoolStorage::clearPlugin(psVar6);
  dynamicgraph::PoolStorage::destroy();
  std::__cxx11::string::~string((string *)&name_entity);
  std::__cxx11::string::~string((string *)&aSignalName);
  std::__cxx11::istringstream::~istringstream((istringstream *)&an_iss);
  std::__cxx11::string::~string((string *)&sub_str_to_test);
  std::__cxx11::string::~string((string *)&sub_s_output_wgph);
  std::__cxx11::string::~string((string *)&s_crmk);
  std::__cxx11::string::~string((string *)&s_output_wgph);
  std::__cxx11::string::~string((string *)&str_to_test);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_output_wgph);
  std::fstream::~fstream(&the_debug_file);
  boost::test_tools::output_test_stream::~output_test_stream(&output);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(pool_display) {
  /// Create Entity
  dg::Entity *entity =
      dg::FactoryStorage::getInstance()->newEntity("MyEntity", "MyEntityInst");

  /// Test exception catching when registering Entity
  bool res = false;
  try {
    dg::Entity *entity2 = dg::FactoryStorage::getInstance()->newEntity(
        "MyEntity", "MyEntityInst");

    bool res2 = (entity2 == entity);
    BOOST_CHECK(res2);
  } catch (const dg::ExceptionFactory &aef) {
    res = (aef.getCode() == dg::ExceptionFactory::OBJECT_CONFLICT);
  }
  BOOST_CHECK(res);

  /// Test exception catching when deregistering Entity
  res = false;
  try {
    dg::FactoryStorage::getInstance()->deregisterEntity("MyEntityInstFailure");
  } catch (const dg::ExceptionFactory &aef) {
    res = (aef.getCode() == dg::ExceptionFactory::OBJECT_CONFLICT);
  }
  BOOST_CHECK(res);

  /// Search for an entity inside the map
  output_test_stream output;
  dg::Entity &e = dg::PoolStorage::getInstance()->getEntity("MyEntityInst");
  e.display(output);
  BOOST_CHECK(output.is_equal("Hello! My name is MyEntityInst !\n"));

  /// Search for an entity inside the map
  res = false;
  try {
    dg::PoolStorage::getInstance()->getEntity("MyEntityInstFailure");
  } catch (const dg::ExceptionFactory &aef) {
    res = (aef.getCode() == dg::ExceptionFactory::UNREFERED_OBJECT);
  }
  BOOST_CHECK(res);

  /// Testing entityMap
  const dg::PoolStorage::Entities &anEntityMap =
      dg::PoolStorage::getInstance()->getEntityMap();

  bool testExistence = anEntityMap.find("MyEntityInst") == anEntityMap.end();
  BOOST_CHECK(!testExistence);

  /// Testing the existence of an entity
  testExistence =
      dg::PoolStorage::getInstance()->existEntity("MyEntityInst", entity);

  BOOST_CHECK(testExistence);

  /// Testing the completion list of pool storage
  dg::PoolStorage::getInstance()->writeCompletionList(output);
  BOOST_CHECK(
      output.is_equal("MyEntityInst.in_double\nMyEntityInst.out_double\n"
                      "print\nsignals\nsignalDep\n"));

  /// Checking the graph generated by the pool
  dg::PoolStorage::getInstance()->writeGraph("output.dot");
  std::fstream the_debug_file;
  the_debug_file.open("output.dot");
  std::ostringstream oss_output_wgph;
  oss_output_wgph << the_debug_file.rdbuf();
  the_debug_file.close();

  /// Use a predefined output
  std::string str_to_test =
      "/* This graph has been automatically generated.\n"
      "   2019 Month: 2 Day: 28 Time: 11:28 */\n"
      "digraph \"output\" { \t graph [ label=\"output\" "
      "bgcolor = white rankdir=LR ]\n"
      "\t node [ fontcolor = black, color = black,fillcolor = gold1,"
      " style=filled, shape=box ] ; \n"
      "\tsubgraph cluster_Entities { \n"
      "\t} \n"
      "\"MyEntityInst\" [ label = \"MyEntityInst\" ,\n"
      "   fontcolor = black, color = black, fillcolor=cyan, style=filled,"
      " shape=box ]\n"
      "}\n";

  /// Check the two substring (remove the date) -
  std::string s_output_wgph = oss_output_wgph.str();
  std::string s_crmk = "*/";

  std::size_t find_s_output_wgph = s_output_wgph.find(s_crmk);
  std::string sub_s_output_wgph =
      s_output_wgph.substr(find_s_output_wgph, s_output_wgph.length());
  std::size_t find_str_to_test = str_to_test.find(s_crmk);
  std::string sub_str_to_test =
      str_to_test.substr(find_str_to_test, str_to_test.length());

  bool two_sub_string_identical;
  two_sub_string_identical = sub_str_to_test == sub_s_output_wgph;
  std::cout << sub_str_to_test << std::endl;
  std::cout << sub_s_output_wgph << std::endl;
  std::cout << sub_str_to_test.compare(sub_s_output_wgph) << std::endl;
  BOOST_CHECK(two_sub_string_identical);

  /// Test name of a valid signal.
  std::istringstream an_iss("MyEntityInst.in_double");

  dg::SignalBase<int> &aSignal =
      dg::PoolStorage::getInstance()->getSignal(an_iss);

  std::string aSignalName = aSignal.getName();
  testExistence =
      aSignalName == "MyEntity(MyEntityInst)::input(double)::in_double";
  BOOST_CHECK(testExistence);

  /// Test name of an unvalid signal.
  an_iss.str("MyEntityInst.in2double");

  try {
    dg::PoolStorage::getInstance()->getSignal(an_iss);
  } catch (const dg::ExceptionFactory &aef) {
    res = (aef.getCode() == dg::ExceptionFactory::UNREFERED_SIGNAL);
  }
  BOOST_CHECK(res);

  /// Deregister the entity.
  dg::PoolStorage::getInstance()->deregisterEntity(entity->getName());

  /// Testing the existance of an entity
  testExistence =
      dg::PoolStorage::getInstance()->existEntity("MyEntityInst", entity);

  BOOST_CHECK(!testExistence);

  /// Create Entity
  std::string name_entity("MyEntityInst2");
  dg::PoolStorage::getInstance()->clearPlugin(name_entity);

  dg::PoolStorage::destroy();
}